

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one.hpp
# Opt level: O0

bool tao::pegtl::internal::contains<char>(char c,initializer_list<char> *l)

{
  const_iterator pcVar1;
  const_iterator __last;
  char *pcVar2;
  initializer_list<char> *l_local;
  char c_local;
  
  l_local._7_1_ = c;
  pcVar1 = std::initializer_list<char>::begin(l);
  __last = std::initializer_list<char>::end(l);
  pcVar2 = std::find<char_const*,char>(pcVar1,__last,(char *)((long)&l_local + 7));
  pcVar1 = std::initializer_list<char>::end(l);
  return pcVar2 != pcVar1;
}

Assistant:

bool contains( const Char c, const std::initializer_list< Char >& l ) noexcept
         {
            return std::find( l.begin(), l.end(), c ) != l.end();
         }